

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreqFlucCorrFunc.cpp
# Opt level: O2

int __thiscall
OpenMD::FreqFlucCorrFunc::computeProperty1(FreqFlucCorrFunc *this,int frame,StuntDouble *sd)

{
  pointer pvVar1;
  bool bVar2;
  Vector3d u;
  MultipoleAdapter ma;
  Vector3d e;
  RealType uedot;
  
  StuntDouble::getElectricField(&e,sd);
  Vector<double,_3U>::Vector(&u.super_Vector<double,_3U>);
  if (sd->objType_ == otRigidBody) {
    StuntDouble::getA((RotMat3x3d *)&uedot,sd);
    RectMatrix<double,_3U,_3U>::getRow
              ((Vector<double,_3U> *)&ma,(RectMatrix<double,_3U,_3U> *)&uedot,2);
    Vector3<double>::operator=(&u,(Vector<double,_3U> *)&ma);
  }
  else {
    ma.at_ = (AtomType *)sd[1]._vptr_StuntDouble;
    bVar2 = MultipoleAdapter::isDipole(&ma);
    if (bVar2) {
      StuntDouble::getDipole((Vector3d *)&uedot,sd);
      Vector<double,_3U>::operator=(&u.super_Vector<double,_3U>,(Vector<double,_3U> *)&uedot);
    }
  }
  uedot = dot<double,3u>(&u.super_Vector<double,_3U>,&e.super_Vector<double,_3U>);
  Utils::Accumulator<double>::add(&this->ueStats_,&uedot);
  std::vector<double,_std::allocator<double>_>::push_back
            ((this->ue_).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + frame,&uedot);
  pvVar1 = (this->ue_).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  return (int)((ulong)((long)*(pointer *)
                              ((long)&pvVar1[frame].
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data + 8) -
                      *(long *)&pvVar1[frame].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data) >> 3) + -1;
}

Assistant:

int FreqFlucCorrFunc::computeProperty1(int frame, StuntDouble* sd) {
    Vector3d e = sd->getElectricField();
    Vector3d u;
    if (sd->isRigidBody()) {
      u = sd->getA().getRow(2);
    } else {
      AtomType* at        = static_cast<Atom*>(sd)->getAtomType();
      MultipoleAdapter ma = MultipoleAdapter(at);

      if (ma.isDipole()) { u = sd->getDipole(); }
    }

    RealType uedot = dot(u, e);
    ueStats_.add(uedot);

    ue_[frame].push_back(uedot);
    return ue_[frame].size() - 1;
  }